

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O0

void double_conversion::PowersOfTenCache::GetCachedPowerForDecimalExponent
               (int requested_exponent,DiyFp *power,int *found_exponent)

{
  int *in_RDX;
  uint64_t *in_RSI;
  int in_EDI;
  CachedPower cached_power;
  int index;
  DiyFp local_40;
  uint64_t local_30;
  undefined8 local_28;
  int local_1c;
  int *local_18;
  uint64_t *local_10;
  
  local_1c = (in_EDI + 0x15c) / 8;
  local_30 = *(uint64_t *)(kCachedPowers + (long)local_1c * 0x10);
  local_28 = *(undefined8 *)(kCachedPowers + (long)local_1c * 0x10 + 8);
  local_18 = in_RDX;
  local_10 = in_RSI;
  DiyFp::DiyFp(&local_40,local_30,(int)(short)local_28);
  *local_10 = local_40.f_;
  *(int32_t *)(local_10 + 1) = local_40.e_;
  *local_18 = (int)local_28._2_2_;
  return;
}

Assistant:

void GetCachedPowerForDecimalExponent(int requested_exponent,
                                      DiyFp* power,
                                      int* found_exponent) {
  DOUBLE_CONVERSION_ASSERT(kMinDecimalExponent <= requested_exponent);
  DOUBLE_CONVERSION_ASSERT(requested_exponent < kMaxDecimalExponent + kDecimalExponentDistance);
  int index =
      (requested_exponent + kCachedPowersOffset) / kDecimalExponentDistance;
  CachedPower cached_power = kCachedPowers[index];
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
  *found_exponent = cached_power.decimal_exponent;
  DOUBLE_CONVERSION_ASSERT(*found_exponent <= requested_exponent);
  DOUBLE_CONVERSION_ASSERT(requested_exponent < *found_exponent + kDecimalExponentDistance);
}